

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::PizCompressor::compress(PizCompressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  Box<Imath_2_5::Vec2<int>_> *in_RSI;
  Vec2<int> *in_RDI;
  char **in_stack_000000c8;
  Box2i *in_stack_000000d0;
  int in_stack_000000dc;
  char *in_stack_000000e0;
  PizCompressor *in_stack_000000e8;
  Vec2<int> local_40;
  Vec2<int> local_38 [4];
  int local_18;
  
  local_18 = in_ECX;
  Imath_2_5::Vec2<int>::Vec2(local_38,in_RDI[9].x,in_ECX);
  iVar2 = in_RDI[9].y;
  iVar1 = (**(code **)((long)*in_RDI + 0x10))();
  Imath_2_5::Vec2<int>::Vec2(&local_40,iVar2,local_18 + iVar1 + -1);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box(in_RSI,in_RDI,(Vec2<int> *)CONCAT44(iVar2,local_18));
  iVar2 = compress(in_stack_000000e8,in_stack_000000e0,in_stack_000000dc,in_stack_000000d0,
                   in_stack_000000c8);
  return iVar2;
}

Assistant:

int
PizCompressor::compress (const char *inPtr,
			 int inSize,
			 int minY,
			 const char *&outPtr)
{
    return compress (inPtr,
		     inSize,
		     Box2i (V2i (_minX, minY),
			    V2i (_maxX, minY + numScanLines() - 1)),
		     outPtr);
}